

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int io_readline(lua_State *L)

{
  GCObject *pGVar1;
  FILE *__stream;
  StkId pTVar2;
  StkId pTVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  char *pcVar7;
  TValue *pTVar8;
  long lVar9;
  StkId pTVar10;
  
  pGVar1 = (L->ci->func->value).gc;
  pTVar8 = (TValue *)&(pGVar1->h).lastfree;
  if ((pGVar1->h).lsizenode == '\0') {
    pTVar8 = &luaO_nilobject_;
  }
  lVar9 = 0x28;
  if (pTVar8->tt != 7) {
    lVar9 = 0;
  }
  __stream = *(FILE **)((long)(pTVar8->value).gc + lVar9);
  if (__stream != (FILE *)0x0) {
    iVar4 = read_line(L,(FILE *)__stream);
    iVar5 = ferror(__stream);
    if (iVar5 == 0) {
      iVar5 = 1;
      if (iVar4 == 0) {
        pTVar2 = L->ci->func;
        pGVar1 = (pTVar2->value).gc;
        pTVar8 = (TValue *)&(pGVar1->h).sizearray;
        if ((pGVar1->h).lsizenode < 2) {
          pTVar8 = &luaO_nilobject_;
        }
        iVar5 = pTVar8->tt;
        if (iVar5 != 0) {
          if ((iVar5 != 1) || ((pTVar8->value).b != 0)) {
            pTVar10 = L->top;
            pTVar3 = L->base;
            if (pTVar10 < pTVar3) {
              do {
                pTVar10->tt = 0;
                pTVar10 = pTVar10 + 1;
              } while (pTVar10 < pTVar3);
              L->top = pTVar10;
            }
            L->top = pTVar3;
            pGVar1 = (pTVar2->value).gc;
            pTVar8 = (TValue *)&(pGVar1->h).lastfree;
            if ((pGVar1->h).lsizenode == '\0') {
              pTVar8 = &luaO_nilobject_;
            }
            pTVar3->value = pTVar8->value;
            pTVar3->tt = ((Value *)((long)pTVar8 + 8))->b;
            L->top = L->top + 1;
            aux_close(L);
          }
          iVar5 = 0;
        }
      }
      return iVar5;
    }
    piVar6 = __errno_location();
    pcVar7 = strerror(*piVar6);
    luaL_error(L,"%s",pcVar7);
  }
  luaL_error(L,"file is already closed");
}

Assistant:

static int io_readline(lua_State*L){
FILE*f=*(FILE**)lua_touserdata(L,lua_upvalueindex(1));
int sucess;
if(f==NULL)
luaL_error(L,"file is already closed");
sucess=read_line(L,f);
if(ferror(f))
return luaL_error(L,"%s",strerror(errno));
if(sucess)return 1;
else{
if(lua_toboolean(L,lua_upvalueindex(2))){
lua_settop(L,0);
lua_pushvalue(L,lua_upvalueindex(1));
aux_close(L);
}
return 0;
}
}